

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.h
# Opt level: O2

void __thiscall llvm::SmallPtrSetImplBase::clear(SmallPtrSetImplBase *this)

{
  uint uVar1;
  
  if (this->CurArray != this->SmallArray) {
    uVar1 = this->CurArraySize;
    if ((0x20 < (ulong)uVar1) && ((this->NumNonEmpty - this->NumTombstones) * 4 < uVar1)) {
      shrink_and_clear(this);
      return;
    }
    memset(this->CurArray,0xff,(ulong)uVar1 << 3);
  }
  this->NumNonEmpty = 0;
  this->NumTombstones = 0;
  return;
}

Assistant:

void clear() {
    incrementEpoch();
    // If the capacity of the array is huge, and the # elements used is small,
    // shrink the array.
    if (!isSmall()) {
      if (size() * 4 < CurArraySize && CurArraySize > 32)
        return shrink_and_clear();
      // Fill the array with empty markers.
      memset(CurArray, -1, CurArraySize * sizeof(void *));
    }

    NumNonEmpty = 0;
    NumTombstones = 0;
  }